

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O0

Session * __thiscall
FIX::SessionFactory::create(SessionFactory *this,SessionID *sessionID,Dictionary *settings)

{
  Application *application;
  MessageStoreFactory *messageStoreFactory;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  ConfigError *pCVar7;
  Session *this_00;
  pointer pSVar8;
  TimeRange *local_1788;
  bool local_1662;
  bool local_1661;
  TimeRange *local_1640;
  bool local_1482;
  allocator<char> local_1449;
  string local_1448;
  string local_1428;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1408;
  allocator<char> local_13d1;
  string local_13d0;
  allocator<char> local_13a9;
  string local_13a8;
  allocator<char> local_1381;
  string local_1380;
  allocator<char> local_1359;
  string local_1358;
  allocator<char> local_1331;
  string local_1330;
  allocator<char> local_1309;
  string local_1308;
  allocator<char> local_12e1;
  string local_12e0;
  allocator<char> local_12b9;
  string local_12b8;
  allocator<char> local_1291;
  string local_1290;
  allocator<char> local_1269;
  string local_1268;
  allocator<char> local_1241;
  string local_1240;
  allocator<char> local_1219;
  string local_1218;
  allocator<char> local_11f1;
  string local_11f0;
  allocator<char> local_11c9;
  string local_11c8;
  allocator<char> local_11a1;
  string local_11a0;
  allocator<char> local_1179;
  string local_1178;
  allocator<char> local_1151;
  string local_1150;
  allocator<char> local_1129;
  string local_1128;
  allocator<char> local_1101;
  string local_1100;
  allocator<char> local_10d9;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  allocator<char> local_1089;
  string local_1088;
  allocator<char> local_1061;
  string local_1060;
  allocator<char> local_1039;
  string local_1038;
  allocator<char> local_1011;
  string local_1010;
  allocator<char> local_fe9;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  allocator<char> local_f99;
  string local_f98;
  allocator<char> local_f71;
  string local_f70;
  undefined1 local_f4a;
  allocator<char> local_f49;
  string local_f48;
  undefined1 local_f22;
  allocator<char> local_f21;
  string local_f20;
  undefined1 local_f00 [8];
  TimeRange logonTimeRange;
  LocalTimeOnly local_ea8;
  undefined1 local_e90 [8];
  TimeRange localLogonTime;
  TimeRange utcLogonTime;
  ConfigError *anon_var_1_3;
  FieldConvertError *e_5;
  string local_dd0;
  string local_db0;
  UtcTimeOnly local_d90;
  ConfigError *anon_var_1_2;
  FieldConvertError *e_4;
  string local_d38;
  string local_d18;
  UtcTimeOnly local_cf8;
  undefined1 local_ce0 [8];
  UtcTimeOnly logoutTime;
  UtcTimeOnly logonTime;
  ConfigError *anon_var_1_1;
  FieldConvertError *e_3;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  int local_c24;
  int local_c20;
  int logoutDay;
  int logonDay;
  unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_> local_bf8;
  unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_> pSession;
  string local_be8;
  allocator<char> local_bc1;
  string local_bc0;
  HeartBtInt local_ba0;
  undefined1 local_b48 [8];
  HeartBtInt heartBtInt;
  string local_ae8;
  byte local_ac1;
  DateTime local_ac0;
  byte local_aa1;
  DateTime local_aa0;
  undefined1 local_a82;
  allocator<char> local_a81;
  string local_a80;
  undefined1 local_a5a;
  allocator<char> local_a59;
  string local_a58;
  undefined1 local_a38 [8];
  TimeRange sessionTimeRange;
  LocalTimeOnly local_9e0;
  undefined1 local_9c8 [8];
  TimeRange localSessionTime;
  TimeRange utcSessionTime;
  ConfigError *e_1;
  FieldConvertError *e_2;
  string local_908;
  string local_8e8;
  UtcTimeOnly local_8c8;
  allocator<char> local_8a9;
  string local_8a8;
  string local_888;
  UtcTimeOnly local_868;
  undefined1 local_850 [8];
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  ConfigError *anon_var_1;
  FieldConvertError *e;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  int local_794;
  int local_790;
  int endDay;
  int startDay;
  allocator<char> local_761;
  string local_760;
  byte local_73a;
  allocator<char> local_739;
  undefined1 local_738 [6];
  bool isNonStopSession;
  allocator<char> local_711;
  string local_710;
  byte local_6e9;
  undefined1 local_6e8 [7];
  bool useLocalTime;
  DataDictionaryProvider dataDictionaryProvider;
  string local_2a0;
  string local_280;
  BeginString local_260;
  StringField local_208;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_160 [8];
  string defaultApplVerID;
  string local_138;
  allocator<char> local_111;
  string local_110;
  byte local_eb;
  undefined1 local_ea;
  allocator<char> local_e9;
  undefined1 local_e8 [5];
  bool useDataDictionary;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string connectionType;
  Dictionary *settings_local;
  SessionID *sessionID_local;
  SessionFactory *this_local;
  
  connectionType.field_2._8_8_ = settings;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ConnectionType",&local_61)
  ;
  Dictionary::getString((string *)local_40,settings,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"acceptor");
  if ((bVar2) &&
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"initiator"), bVar2)) {
    local_9a = 1;
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Invalid ConnectionType",&local_99);
    ConfigError::ConfigError(pCVar7,&local_98);
    local_9a = 0;
    __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  local_c2 = 0;
  local_c3 = 0;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"acceptor");
  uVar1 = connectionType.field_2._8_8_;
  local_1482 = false;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"SessionQualifier",&local_c1);
    local_c3 = 1;
    local_1482 = Dictionary::has((Dictionary *)uVar1,&local_c0);
  }
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_c1);
  }
  uVar1 = connectionType.field_2._8_8_;
  if (local_1482 != false) {
    local_ea = 1;
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"SessionQualifier cannot be used with acceptor.",&local_e9);
    ConfigError::ConfigError(pCVar7,(string *)local_e8);
    local_ea = 0;
    __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  local_eb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"UseDataDictionary",&local_111);
  bVar2 = Dictionary::has((Dictionary *)uVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  uVar1 = connectionType.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"UseDataDictionary",
               (allocator<char> *)(defaultApplVerID.field_2._M_local_buf + 0xf));
    local_eb = Dictionary::getBool((Dictionary *)uVar1,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator
              ((allocator<char> *)(defaultApplVerID.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::string((string *)local_160);
  bVar2 = SessionID::isFIXT(sessionID);
  uVar1 = connectionType.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"DefaultApplVerID",&local_181);
    bVar2 = Dictionary::has((Dictionary *)uVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    uVar1 = connectionType.field_2._8_8_;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      local_1aa = 1;
      pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"ApplVerID is required for FIXT transport",&local_1a9);
      ConfigError::ConfigError(pCVar7,&local_1a8);
      local_1aa = 0;
      __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"DefaultApplVerID",
               (allocator<char> *)
               ((long)&dataDictionaryProvider.emptyDataDictionary.m_messageOrderedFields._M_t.
                       _M_impl.super__Rb_tree_header._M_node_count + 7));
    Dictionary::getString(&local_280,(Dictionary *)uVar1,&local_2a0,false);
    BeginString::BeginString(&local_260,&local_280);
    Message::toApplVerID((ApplVerID *)&local_208,&local_260);
    psVar6 = StringField::operator_cast_to_string_(&local_208);
    std::__cxx11::string::operator=((string *)local_160,(string *)psVar6);
    ApplVerID::~ApplVerID((ApplVerID *)&local_208);
    BeginString::~BeginString(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dataDictionaryProvider.emptyDataDictionary.m_messageOrderedFields._M_t.
                       _M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_6e8);
  if ((local_eb & 1) != 0) {
    bVar2 = SessionID::isFIXT(sessionID);
    if (bVar2) {
      processFixtDataDictionaries
                (this,sessionID,(Dictionary *)connectionType.field_2._8_8_,
                 (DataDictionaryProvider *)local_6e8);
    }
    else {
      processFixDataDictionary
                (this,sessionID,(Dictionary *)connectionType.field_2._8_8_,
                 (DataDictionaryProvider *)local_6e8);
    }
  }
  uVar1 = connectionType.field_2._8_8_;
  local_6e9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"UseLocalTime",&local_711)
  ;
  bVar2 = Dictionary::has((Dictionary *)uVar1,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  uVar1 = connectionType.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_738,"UseLocalTime",&local_739);
    local_6e9 = Dictionary::getBool((Dictionary *)uVar1,(string *)local_738);
    std::__cxx11::string::~string((string *)local_738);
    std::allocator<char>::~allocator(&local_739);
  }
  uVar1 = connectionType.field_2._8_8_;
  local_73a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"NonStopSession",&local_761);
  bVar2 = Dictionary::has((Dictionary *)uVar1,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  uVar1 = connectionType.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&startDay,"NonStopSession",(allocator<char> *)((long)&endDay + 3));
    local_73a = Dictionary::getBool((Dictionary *)uVar1,(string *)&startDay);
    std::__cxx11::string::~string((string *)&startDay);
    std::allocator<char>::~allocator((allocator<char> *)((long)&endDay + 3));
  }
  uVar1 = connectionType.field_2._8_8_;
  local_790 = 0xffffffff;
  local_794 = 0xffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"StartDay",&local_7b9);
  local_790 = Dictionary::getDay((Dictionary *)uVar1,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  uVar1 = connectionType.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e0,"EndDay",(allocator<char> *)((long)&e + 7));
  local_794 = Dictionary::getDay((Dictionary *)uVar1,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time,0,0,0,0);
  UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_850,0,0,0,0);
  uVar1 = connectionType.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"StartTime",&local_8a9);
  Dictionary::getString(&local_888,(Dictionary *)uVar1,&local_8a8,false);
  UtcTimeOnlyConvertor::convert(&local_868,&local_888);
  UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,&local_868);
  UtcTimeOnly::~UtcTimeOnly(&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  uVar1 = connectionType.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"EndTime",(allocator<char> *)((long)&e_2 + 7));
  Dictionary::getString(&local_8e8,(Dictionary *)uVar1,&local_908,false);
  UtcTimeOnlyConvertor::convert(&local_8c8,&local_8e8);
  UtcTimeOnly::operator=((UtcTimeOnly *)local_850,&local_8c8);
  UtcTimeOnly::~UtcTimeOnly(&local_8c8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
  TimeRange::TimeRange
            ((TimeRange *)&localSessionTime.m_useLocalTime,
             (UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_850,local_790,
             local_794);
  iVar3 = DateTime::getHour((DateTime *)&endTime.super_DateTime.m_time);
  iVar4 = DateTime::getMinute((DateTime *)&endTime.super_DateTime.m_time);
  iVar5 = DateTime::getSecond((DateTime *)&endTime.super_DateTime.m_time);
  LocalTimeOnly::LocalTimeOnly(&local_9e0,iVar3,iVar4,iVar5,0);
  iVar3 = DateTime::getHour((DateTime *)local_850);
  iVar4 = DateTime::getMinute((DateTime *)local_850);
  iVar5 = DateTime::getSecond((DateTime *)local_850);
  LocalTimeOnly::LocalTimeOnly
            ((LocalTimeOnly *)&sessionTimeRange.m_useLocalTime,iVar3,iVar4,iVar5,0);
  TimeRange::TimeRange
            ((TimeRange *)local_9c8,&local_9e0,(LocalTimeOnly *)&sessionTimeRange.m_useLocalTime,
             local_790,local_794);
  LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&sessionTimeRange.m_useLocalTime);
  LocalTimeOnly::~LocalTimeOnly(&local_9e0);
  if ((local_6e9 & 1) == 0) {
    local_1640 = (TimeRange *)&localSessionTime.m_useLocalTime;
  }
  else {
    local_1640 = (TimeRange *)local_9c8;
  }
  TimeRange::TimeRange((TimeRange *)local_a38,local_1640);
  if ((-1 < local_790) && (local_794 < 0)) {
    local_a5a = 1;
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a58,"StartDay used without EndDay",&local_a59);
    ConfigError::ConfigError(pCVar7,&local_a58);
    local_a5a = 0;
    __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  if ((-1 < local_794) && (local_790 < 0)) {
    local_a82 = 1;
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"EndDay used without StartDay",&local_a81);
    ConfigError::ConfigError(pCVar7,&local_a80);
    local_a82 = 0;
    __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  local_aa1 = 0;
  local_ac1 = 0;
  local_1661 = false;
  if ((local_73a & 1) != 0) {
    local_1662 = true;
    if ((local_790 < 0) && (local_1662 = true, local_794 < 0)) {
      UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_aa0,0,0,0,0);
      local_aa1 = 1;
      bVar2 = FIX::operator!=((DateTime *)&endTime.super_DateTime.m_time,&local_aa0);
      local_1662 = true;
      if (!bVar2) {
        UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_ac0,0,0,0,0);
        local_ac1 = 1;
        local_1662 = FIX::operator!=((DateTime *)local_850,&local_ac0);
      }
    }
    local_1661 = local_1662;
  }
  if ((local_ac1 & 1) != 0) {
    UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&local_ac0);
  }
  if ((local_aa1 & 1) != 0) {
    UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&local_aa0);
  }
  if (local_1661 != false) {
    heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum._2_1_ = 1;
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae8,"NonStopSession used with StartTime/EndTime/StartDay/EndDay",
               (allocator<char> *)
               ((long)&heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum + 3));
    ConfigError::ConfigError(pCVar7,&local_ae8);
    heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum._2_1_ = 0;
    __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  HeartBtInt::HeartBtInt((HeartBtInt *)local_b48,0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"initiator");
  uVar1 = connectionType.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc0,"HeartBtInt",&local_bc1)
    ;
    iVar3 = Dictionary::getInt((Dictionary *)uVar1,&local_bc0);
    HeartBtInt::HeartBtInt(&local_ba0,iVar3);
    HeartBtInt::operator=((HeartBtInt *)local_b48,&local_ba0);
    HeartBtInt::~HeartBtInt(&local_ba0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::allocator<char>::~allocator(&local_bc1);
    iVar3 = IntField::operator_cast_to_int((IntField *)local_b48);
    if (iVar3 < 1) {
      pSession._M_t.super___uniq_ptr_impl<FIX::Session,_std::default_delete<FIX::Session>_>._M_t.
      super__Tuple_impl<0UL,_FIX::Session_*,_std::default_delete<FIX::Session>_>.
      super__Head_base<0UL,_FIX::Session_*,_false>._M_head_impl._6_1_ = 1;
      pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_be8,"Heartbeat must be greater than zero",
                 (allocator<char> *)
                 ((long)&pSession._M_t.
                         super___uniq_ptr_impl<FIX::Session,_std::default_delete<FIX::Session>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_FIX::Session_*,_std::default_delete<FIX::Session>_>.
                         super__Head_base<0UL,_FIX::Session_*,_false>._M_head_impl + 7));
      ConfigError::ConfigError(pCVar7,&local_be8);
      pSession._M_t.super___uniq_ptr_impl<FIX::Session,_std::default_delete<FIX::Session>_>._M_t.
      super__Tuple_impl<0UL,_FIX::Session_*,_std::default_delete<FIX::Session>_>.
      super__Head_base<0UL,_FIX::Session_*,_false>._M_head_impl._6_1_ = 0;
      __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
  }
  std::unique_ptr<FIX::Session,std::default_delete<FIX::Session>>::
  unique_ptr<std::default_delete<FIX::Session>,void>
            ((unique_ptr<FIX::Session,std::default_delete<FIX::Session>> *)&local_bf8);
  this_00 = (Session *)operator_new(0x878);
  logoutDay._2_1_ = 1;
  std::function<FIX::UtcTimeStamp()>::
  function<FIX::SessionFactory::create(FIX::SessionID_const&,FIX::Dictionary_const&)::__0,void>
            ((function<FIX::UtcTimeStamp()> *)&logonDay,
             (anon_class_1_0_00000001 *)((long)&logoutDay + 3));
  application = this->m_application;
  messageStoreFactory = this->m_messageStoreFactory;
  iVar3 = IntField::operator_cast_to_int((IntField *)local_b48);
  Session::Session(this_00,(function<FIX::UtcTimeStamp_()> *)&logonDay,application,
                   messageStoreFactory,sessionID,(DataDictionaryProvider *)local_6e8,
                   (TimeRange *)local_a38,iVar3,this->m_pLogFactory);
  logoutDay._2_1_ = 0;
  std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::reset(&local_bf8,this_00);
  std::function<FIX::UtcTimeStamp_()>::~function((function<FIX::UtcTimeStamp_()> *)&logonDay);
  pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->(&local_bf8)
  ;
  Session::setSenderDefaultApplVerID(pSVar8,(string *)local_160);
  uVar1 = connectionType.field_2._8_8_;
  local_c20 = local_790;
  local_c24 = local_794;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"LogonDay",&local_c49);
  local_c20 = Dictionary::getDay((Dictionary *)uVar1,&local_c48);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator(&local_c49);
  uVar1 = connectionType.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c70,"LogoutDay",(allocator<char> *)((long)&e_3 + 7));
  local_c24 = Dictionary::getDay((Dictionary *)uVar1,&local_c70);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_3 + 7));
  UtcTimeOnly::UtcTimeOnly
            ((UtcTimeOnly *)&logoutTime.super_DateTime.m_time,
             (UtcTimeOnly *)&endTime.super_DateTime.m_time);
  UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_ce0,(UtcTimeOnly *)local_850);
  uVar1 = connectionType.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"LogonTime",(allocator<char> *)((long)&e_4 + 7));
  Dictionary::getString(&local_d18,(Dictionary *)uVar1,&local_d38,false);
  UtcTimeOnlyConvertor::convert(&local_cf8,&local_d18);
  UtcTimeOnly::operator=((UtcTimeOnly *)&logoutTime.super_DateTime.m_time,&local_cf8);
  UtcTimeOnly::~UtcTimeOnly(&local_cf8);
  std::__cxx11::string::~string((string *)&local_d18);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
  uVar1 = connectionType.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dd0,"LogoutTime",(allocator<char> *)((long)&e_5 + 7));
  Dictionary::getString(&local_db0,(Dictionary *)uVar1,&local_dd0,false);
  UtcTimeOnlyConvertor::convert(&local_d90,&local_db0);
  UtcTimeOnly::operator=((UtcTimeOnly *)local_ce0,&local_d90);
  UtcTimeOnly::~UtcTimeOnly(&local_d90);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_5 + 7));
  TimeRange::TimeRange
            ((TimeRange *)&localLogonTime.m_useLocalTime,
             (UtcTimeOnly *)&logoutTime.super_DateTime.m_time,(UtcTimeOnly *)local_ce0,local_c20,
             local_c24);
  iVar3 = DateTime::getHour((DateTime *)&logoutTime.super_DateTime.m_time);
  iVar4 = DateTime::getMinute((DateTime *)&logoutTime.super_DateTime.m_time);
  iVar5 = DateTime::getSecond((DateTime *)&logoutTime.super_DateTime.m_time);
  LocalTimeOnly::LocalTimeOnly(&local_ea8,iVar3,iVar4,iVar5,0);
  iVar3 = DateTime::getHour((DateTime *)local_ce0);
  iVar4 = DateTime::getMinute((DateTime *)local_ce0);
  iVar5 = DateTime::getSecond((DateTime *)local_ce0);
  LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)&logonTimeRange.m_useLocalTime,iVar3,iVar4,iVar5,0);
  TimeRange::TimeRange
            ((TimeRange *)local_e90,&local_ea8,(LocalTimeOnly *)&logonTimeRange.m_useLocalTime,
             local_c20,local_c24);
  LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&logonTimeRange.m_useLocalTime);
  LocalTimeOnly::~LocalTimeOnly(&local_ea8);
  if ((local_6e9 & 1) == 0) {
    local_1788 = (TimeRange *)&localLogonTime.m_useLocalTime;
  }
  else {
    local_1788 = (TimeRange *)local_e90;
  }
  TimeRange::TimeRange((TimeRange *)local_f00,local_1788);
  bVar2 = TimeRange::isInRange
                    ((TimeRange *)local_a38,(DateTime *)&logoutTime.super_DateTime.m_time,local_c20)
  ;
  if (bVar2) {
    bVar2 = TimeRange::isInRange((TimeRange *)local_a38,(DateTime *)local_ce0,local_c24);
    if (bVar2) {
      pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                         (&local_bf8);
      Session::setLogonTime(pSVar8,(TimeRange *)local_f00);
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f70,"SendRedundantResendRequests",&local_f71);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_f70);
      std::__cxx11::string::~string((string *)&local_f70);
      std::allocator<char>::~allocator(&local_f71);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f98,"SendRedundantResendRequests",&local_f99);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_f98);
        Session::setSendRedundantResendRequests(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_f98);
        std::allocator<char>::~allocator(&local_f99);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fc0,"CheckCompID",&local_fc1);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_fc0);
      std::__cxx11::string::~string((string *)&local_fc0);
      std::allocator<char>::~allocator(&local_fc1);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fe8,"CheckCompID",&local_fe9);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_fe8);
        Session::setCheckCompId(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_fe8);
        std::allocator<char>::~allocator(&local_fe9);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1010,"CheckLatency",&local_1011);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1010);
      std::__cxx11::string::~string((string *)&local_1010);
      std::allocator<char>::~allocator(&local_1011);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1038,"CheckLatency",&local_1039);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_1038);
        Session::setCheckLatency(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_1038);
        std::allocator<char>::~allocator(&local_1039);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1060,"MaxLatency",&local_1061);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1060);
      std::__cxx11::string::~string((string *)&local_1060);
      std::allocator<char>::~allocator(&local_1061);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1088,"MaxLatency",&local_1089);
        iVar3 = Dictionary::getInt((Dictionary *)uVar1,&local_1088);
        Session::setMaxLatency(pSVar8,iVar3);
        std::__cxx11::string::~string((string *)&local_1088);
        std::allocator<char>::~allocator(&local_1089);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10b0,"LogonTimeout",&local_10b1);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_10b0);
      std::__cxx11::string::~string((string *)&local_10b0);
      std::allocator<char>::~allocator(&local_10b1);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10d8,"LogonTimeout",&local_10d9);
        iVar3 = Dictionary::getInt((Dictionary *)uVar1,&local_10d8);
        Session::setLogonTimeout(pSVar8,iVar3);
        std::__cxx11::string::~string((string *)&local_10d8);
        std::allocator<char>::~allocator(&local_10d9);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1100,"LogoutTimeout",&local_1101);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1100);
      std::__cxx11::string::~string((string *)&local_1100);
      std::allocator<char>::~allocator(&local_1101);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1128,"LogoutTimeout",&local_1129);
        iVar3 = Dictionary::getInt((Dictionary *)uVar1,&local_1128);
        Session::setLogoutTimeout(pSVar8,iVar3);
        std::__cxx11::string::~string((string *)&local_1128);
        std::allocator<char>::~allocator(&local_1129);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1150,"ResetOnLogon",&local_1151);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1150);
      std::__cxx11::string::~string((string *)&local_1150);
      std::allocator<char>::~allocator(&local_1151);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1178,"ResetOnLogon",&local_1179);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_1178);
        Session::setResetOnLogon(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_1178);
        std::allocator<char>::~allocator(&local_1179);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11a0,"ResetOnLogout",&local_11a1);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_11a0);
      std::__cxx11::string::~string((string *)&local_11a0);
      std::allocator<char>::~allocator(&local_11a1);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11c8,"ResetOnLogout",&local_11c9);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_11c8);
        Session::setResetOnLogout(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_11c8);
        std::allocator<char>::~allocator(&local_11c9);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11f0,"ResetOnDisconnect",&local_11f1);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_11f0);
      std::__cxx11::string::~string((string *)&local_11f0);
      std::allocator<char>::~allocator(&local_11f1);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1218,"ResetOnDisconnect",&local_1219);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_1218);
        Session::setResetOnDisconnect(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_1218);
        std::allocator<char>::~allocator(&local_1219);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1240,"RefreshOnLogon",&local_1241);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1240);
      std::__cxx11::string::~string((string *)&local_1240);
      std::allocator<char>::~allocator(&local_1241);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1268,"RefreshOnLogon",&local_1269);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_1268);
        Session::setRefreshOnLogon(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_1268);
        std::allocator<char>::~allocator(&local_1269);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1290,"MillisecondsInTimeStamp",&local_1291);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1290);
      std::__cxx11::string::~string((string *)&local_1290);
      std::allocator<char>::~allocator(&local_1291);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12b8,"MillisecondsInTimeStamp",&local_12b9);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_12b8);
        Session::setMillisecondsInTimeStamp(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_12b8);
        std::allocator<char>::~allocator(&local_12b9);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12e0,"PersistMessages",&local_12e1);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_12e0);
      std::__cxx11::string::~string((string *)&local_12e0);
      std::allocator<char>::~allocator(&local_12e1);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1308,"PersistMessages",&local_1309);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_1308);
        Session::setPersistMessages(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_1308);
        std::allocator<char>::~allocator(&local_1309);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1330,"ValidateLengthAndChecksum",&local_1331);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1330);
      std::__cxx11::string::~string((string *)&local_1330);
      std::allocator<char>::~allocator(&local_1331);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1358,"ValidateLengthAndChecksum",&local_1359);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_1358);
        Session::setValidateLengthAndChecksum(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_1358);
        std::allocator<char>::~allocator(&local_1359);
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1380,"SendNextExpectedMsgSeqNum",&local_1381);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_1380);
      std::__cxx11::string::~string((string *)&local_1380);
      std::allocator<char>::~allocator(&local_1381);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13a8,"SendNextExpectedMsgSeqNum",&local_13a9);
        bVar2 = Dictionary::getBool((Dictionary *)uVar1,&local_13a8);
        Session::setSendNextExpectedMsgSeqNum(pSVar8,bVar2);
        std::__cxx11::string::~string((string *)&local_13a8);
        std::allocator<char>::~allocator(&local_13a9);
      }
      if ((local_73a & 1) != 0) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        Session::setIsNonStopSession(pSVar8,(bool)(local_73a & 1));
      }
      uVar1 = connectionType.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13d0,"AllowedRemoteAddresses",&local_13d1);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_13d0);
      std::__cxx11::string::~string((string *)&local_13d0);
      std::allocator<char>::~allocator(&local_13d1);
      if (bVar2) {
        pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::operator->
                           (&local_bf8);
        uVar1 = connectionType.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1448,"AllowedRemoteAddresses",&local_1449);
        Dictionary::getString(&local_1428,(Dictionary *)uVar1,&local_1448,false);
        string_split(&local_1408,&local_1428,',');
        Session::setAllowedRemoteAddresses(pSVar8,&local_1408);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set(&local_1408);
        std::__cxx11::string::~string((string *)&local_1428);
        std::__cxx11::string::~string((string *)&local_1448);
        std::allocator<char>::~allocator(&local_1449);
      }
      pSVar8 = std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::release
                         (&local_bf8);
      TimeRange::~TimeRange((TimeRange *)local_f00);
      TimeRange::~TimeRange((TimeRange *)local_e90);
      TimeRange::~TimeRange((TimeRange *)&localLogonTime.m_useLocalTime);
      UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_ce0);
      UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&logoutTime.super_DateTime.m_time);
      std::unique_ptr<FIX::Session,_std::default_delete<FIX::Session>_>::~unique_ptr(&local_bf8);
      HeartBtInt::~HeartBtInt((HeartBtInt *)local_b48);
      TimeRange::~TimeRange((TimeRange *)local_a38);
      TimeRange::~TimeRange((TimeRange *)local_9c8);
      TimeRange::~TimeRange((TimeRange *)&localSessionTime.m_useLocalTime);
      UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_850);
      UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time);
      DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_6e8);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)local_40);
      return pSVar8;
    }
    local_f4a = 1;
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f48,"LogoutTime must be between StartTime and EndTime",&local_f49);
    ConfigError::ConfigError(pCVar7,&local_f48);
    local_f4a = 0;
    __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  local_f22 = 1;
  pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f20,"LogonTime must be between StartTime and EndTime",&local_f21);
  ConfigError::ConfigError(pCVar7,&local_f20);
  local_f22 = 0;
  __cxa_throw(pCVar7,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

EXCEPT(ConfigError) {
  std::string connectionType = settings.getString(CONNECTION_TYPE);
  if (connectionType != "acceptor" && connectionType != "initiator") {
    throw ConfigError("Invalid ConnectionType");
  }

  if (connectionType == "acceptor" && settings.has(SESSION_QUALIFIER)) {
    throw ConfigError("SessionQualifier cannot be used with acceptor.");
  }

  bool useDataDictionary = true;
  if (settings.has(USE_DATA_DICTIONARY)) {
    useDataDictionary = settings.getBool(USE_DATA_DICTIONARY);
  }

  std::string defaultApplVerID;
  if (sessionID.isFIXT()) {
    if (!settings.has(DEFAULT_APPLVERID)) {
      throw ConfigError("ApplVerID is required for FIXT transport");
    }
    defaultApplVerID = Message::toApplVerID(settings.getString(DEFAULT_APPLVERID));
  }

  DataDictionaryProvider dataDictionaryProvider;
  if (useDataDictionary) {
    if (sessionID.isFIXT()) {
      processFixtDataDictionaries(sessionID, settings, dataDictionaryProvider);
    } else {
      processFixDataDictionary(sessionID, settings, dataDictionaryProvider);
    }
  }

  bool useLocalTime = false;
  if (settings.has(USE_LOCAL_TIME)) {
    useLocalTime = settings.getBool(USE_LOCAL_TIME);
  }

  bool isNonStopSession = false;
  if (settings.has(NON_STOP_SESSION)) {
    isNonStopSession = settings.getBool(NON_STOP_SESSION);
  }

  int startDay = -1;
  int endDay = -1;
  try {
    startDay = settings.getDay(START_DAY);
    endDay = settings.getDay(END_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly startTime = UtcTimeOnly(0, 0, 0);
  UtcTimeOnly endTime = UtcTimeOnly(0, 0, 0);
  try {
    startTime = UtcTimeOnlyConvertor::convert(settings.getString(START_TIME));
    endTime = UtcTimeOnlyConvertor::convert(settings.getString(END_TIME));
  } catch (ConfigError &e) {
    if (!isNonStopSession) {
      throw e;
    }
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcSessionTime(startTime, endTime, startDay, endDay);
  TimeRange localSessionTime(
      LocalTimeOnly(startTime.getHour(), startTime.getMinute(), startTime.getSecond()),
      LocalTimeOnly(endTime.getHour(), endTime.getMinute(), endTime.getSecond()),
      startDay,
      endDay);
  TimeRange sessionTimeRange = useLocalTime ? localSessionTime : utcSessionTime;

  if (startDay >= 0 && endDay < 0) {
    throw ConfigError("StartDay used without EndDay");
  }
  if (endDay >= 0 && startDay < 0) {
    throw ConfigError("EndDay used without StartDay");
  }

  if (isNonStopSession
      && (startDay >= 0 || endDay >= 0 || startTime != UtcTimeOnly(0, 0, 0) || endTime != UtcTimeOnly(0, 0, 0))) {
    throw ConfigError("NonStopSession used with StartTime/EndTime/StartDay/EndDay");
  }

  HeartBtInt heartBtInt(0);
  if (connectionType == "initiator") {
    heartBtInt = HeartBtInt(settings.getInt(HEARTBTINT));
    if (heartBtInt <= 0) {
      throw ConfigError("Heartbeat must be greater than zero");
    }
  }

  std::unique_ptr<Session> pSession;
  pSession.reset(new Session(
      []() { return UtcTimeStamp::now(); },
      m_application,
      m_messageStoreFactory,
      sessionID,
      dataDictionaryProvider,
      sessionTimeRange,
      heartBtInt,
      m_pLogFactory));

  pSession->setSenderDefaultApplVerID(defaultApplVerID);

  int logonDay = startDay;
  int logoutDay = endDay;
  try {
    logonDay = settings.getDay(LOGON_DAY);
    logoutDay = settings.getDay(LOGOUT_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly logonTime(startTime);
  UtcTimeOnly logoutTime(endTime);
  try {
    logonTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGON_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  try {
    logoutTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGOUT_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcLogonTime(logonTime, logoutTime, logonDay, logoutDay);
  TimeRange localLogonTime(
      LocalTimeOnly(logonTime.getHour(), logonTime.getMinute(), logonTime.getSecond()),
      LocalTimeOnly(logoutTime.getHour(), logoutTime.getMinute(), logoutTime.getSecond()),
      logonDay,
      logoutDay);
  TimeRange logonTimeRange = useLocalTime ? localLogonTime : utcLogonTime;

  if (!sessionTimeRange.isInRange(logonTime, logonDay)) {
    throw ConfigError("LogonTime must be between StartTime and EndTime");
  }
  if (!sessionTimeRange.isInRange(logoutTime, logoutDay)) {
    throw ConfigError("LogoutTime must be between StartTime and EndTime");
  }
  pSession->setLogonTime(logonTimeRange);

  if (settings.has(SEND_REDUNDANT_RESENDREQUESTS)) {
    pSession->setSendRedundantResendRequests(settings.getBool(SEND_REDUNDANT_RESENDREQUESTS));
  }
  if (settings.has(CHECK_COMPID)) {
    pSession->setCheckCompId(settings.getBool(CHECK_COMPID));
  }
  if (settings.has(CHECK_LATENCY)) {
    pSession->setCheckLatency(settings.getBool(CHECK_LATENCY));
  }
  if (settings.has(MAX_LATENCY)) {
    pSession->setMaxLatency(settings.getInt(MAX_LATENCY));
  }
  if (settings.has(LOGON_TIMEOUT)) {
    pSession->setLogonTimeout(settings.getInt(LOGON_TIMEOUT));
  }
  if (settings.has(LOGOUT_TIMEOUT)) {
    pSession->setLogoutTimeout(settings.getInt(LOGOUT_TIMEOUT));
  }
  if (settings.has(RESET_ON_LOGON)) {
    pSession->setResetOnLogon(settings.getBool(RESET_ON_LOGON));
  }
  if (settings.has(RESET_ON_LOGOUT)) {
    pSession->setResetOnLogout(settings.getBool(RESET_ON_LOGOUT));
  }
  if (settings.has(RESET_ON_DISCONNECT)) {
    pSession->setResetOnDisconnect(settings.getBool(RESET_ON_DISCONNECT));
  }
  if (settings.has(REFRESH_ON_LOGON)) {
    pSession->setRefreshOnLogon(settings.getBool(REFRESH_ON_LOGON));
  }
  if (settings.has(MILLISECONDS_IN_TIMESTAMP)) {
    pSession->setMillisecondsInTimeStamp(settings.getBool(MILLISECONDS_IN_TIMESTAMP));
  }
  if (settings.has(PERSIST_MESSAGES)) {
    pSession->setPersistMessages(settings.getBool(PERSIST_MESSAGES));
  }
  if (settings.has(VALIDATE_LENGTH_AND_CHECKSUM)) {
    pSession->setValidateLengthAndChecksum(settings.getBool(VALIDATE_LENGTH_AND_CHECKSUM));
  }
  if (settings.has(SEND_NEXT_EXPECTED_MSG_SEQ_NUM)) {
    pSession->setSendNextExpectedMsgSeqNum(settings.getBool(SEND_NEXT_EXPECTED_MSG_SEQ_NUM));
  }
  if (isNonStopSession) {
    pSession->setIsNonStopSession(isNonStopSession);
  }
  if (settings.has(ALLOWED_REMOTE_ADDRESSES)) {
    pSession->setAllowedRemoteAddresses(string_split(settings.getString(ALLOWED_REMOTE_ADDRESSES), ','));
  }

  return pSession.release();
}